

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.c
# Opt level: O0

uint32_t readUint32InBigEndian(void *memory)

{
  uint8_t *p;
  void *memory_local;
  
  return (uint)*memory << 0x18 | (uint)*(byte *)((long)memory + 1) << 0x10 |
         (uint)*(byte *)((long)memory + 2) << 8 | (uint)*(byte *)((long)memory + 3);
}

Assistant:

uint32_t readUint32InBigEndian(void* memory)
{
	uint8_t* p = memory;
	return (((uint32_t)p[0]) << 24) | 
		   (((uint32_t)p[1]) << 16) |
		   (((uint32_t)p[2]) <<  8) |
		   (((uint32_t)p[3]));
}